

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderRendering.cpp
# Opt level: O2

void __thiscall
glcts::GeometryShaderRenderingLinesCase::~GeometryShaderRenderingLinesCase
          (GeometryShaderRenderingLinesCase *this)

{
  (this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__GeometryShaderRenderingLinesCase_01df9310;
  if (this->m_raw_array_instanced_data != (float *)0x0) {
    operator_delete__(this->m_raw_array_instanced_data);
    this->m_raw_array_instanced_data = (float *)0x0;
  }
  if (this->m_raw_array_noninstanced_data != (float *)0x0) {
    operator_delete__(this->m_raw_array_noninstanced_data);
    this->m_raw_array_noninstanced_data = (float *)0x0;
  }
  if (this->m_unordered_array_instanced_data != (float *)0x0) {
    operator_delete__(this->m_unordered_array_instanced_data);
    this->m_unordered_array_instanced_data = (float *)0x0;
  }
  if (this->m_unordered_array_noninstanced_data != (float *)0x0) {
    operator_delete__(this->m_unordered_array_noninstanced_data);
    this->m_unordered_array_noninstanced_data = (float *)0x0;
  }
  if (this->m_unordered_elements_instanced_data != (uchar *)0x0) {
    operator_delete__(this->m_unordered_elements_instanced_data);
    this->m_unordered_elements_instanced_data = (uchar *)0x0;
  }
  if (this->m_unordered_elements_noninstanced_data != (uchar *)0x0) {
    operator_delete__(this->m_unordered_elements_noninstanced_data);
    this->m_unordered_elements_noninstanced_data = (uchar *)0x0;
  }
  TestCaseBase::~TestCaseBase((TestCaseBase *)this);
  return;
}

Assistant:

GeometryShaderRenderingLinesCase::~GeometryShaderRenderingLinesCase()
{
	if (m_raw_array_instanced_data != NULL)
	{
		delete[] m_raw_array_instanced_data;

		m_raw_array_instanced_data = NULL;
	}

	if (m_raw_array_noninstanced_data != NULL)
	{
		delete[] m_raw_array_noninstanced_data;

		m_raw_array_noninstanced_data = NULL;
	}

	if (m_unordered_array_instanced_data != NULL)
	{
		delete[] m_unordered_array_instanced_data;

		m_unordered_array_instanced_data = NULL;
	}

	if (m_unordered_array_noninstanced_data != NULL)
	{
		delete[] m_unordered_array_noninstanced_data;

		m_unordered_array_noninstanced_data = NULL;
	}

	if (m_unordered_elements_instanced_data != NULL)
	{
		delete[] m_unordered_elements_instanced_data;

		m_unordered_elements_instanced_data = NULL;
	}

	if (m_unordered_elements_noninstanced_data != NULL)
	{
		delete[] m_unordered_elements_noninstanced_data;

		m_unordered_elements_noninstanced_data = NULL;
	}
}